

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86::create_pipeline(ConvolutionDepthWise_x86 *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  Layer *pLVar6;
  long *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  Mat *in_RSI;
  long *in_RDI;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_000006a0;
  ConvolutionDepthWise_x86 *in_stack_000006a8;
  Option *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  int iVar11;
  void **ppvVar10;
  Mat *dst;
  undefined4 in_stack_fffffffffffffe90;
  void *local_150;
  int *local_148;
  Allocator *in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  Mat *in_stack_fffffffffffffed8;
  Option *in_stack_fffffffffffffee0;
  ConvolutionDepthWise_x86 *in_stack_fffffffffffffee8;
  int local_104;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int local_e4;
  
  iVar11 = (int)((ulong)in_stack_fffffffffffffe80 >> 0x20);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x160) == 0) {
    pLVar6 = create_activation_layer
                       ((int)((ulong)in_RDI >> 0x20),in_RSI,
                        (Option *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    in_RDI[1] = (long)pLVar6;
    if (((in_RSI->field_0x1e & 1) == 0) ||
       (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x178) != 1)) {
      uVar3 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) /
              (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      iVar4 = (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) /
                   (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                         *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)));
      iVar5 = (iVar4 / (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) /
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108))) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108);
      if ((iVar5 == *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108)) &&
         (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) ==
          *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))) {
        local_104 = 1;
        if ((((ulong)in_RSI->allocator & 0x100000000000000) != 0) && (local_104 = 1, iVar5 % 4 == 0)
           ) {
          local_104 = 4;
        }
        if (local_104 == 4) {
          dst = (Mat *)&local_150;
          Mat::reshape(in_stack_fffffffffffffed8,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0
                       ,in_stack_fffffffffffffec8);
          convert_packing((Mat *)CONCAT44(iVar4,in_stack_fffffffffffffe90),dst,iVar11,
                          in_stack_fffffffffffffe78);
          ppvVar10 = &local_150;
          if (local_148 != (int *)0x0) {
            LOCK();
            iVar11 = *local_148;
            *local_148 = *local_148 + -1;
            UNLOCK();
            if (iVar11 == 1) {
              if (CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0) == 0) {
                if (local_150 != (void *)0x0) {
                  free(local_150);
                }
              }
              else {
                (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0)
                            + 0x18))
                          ((long *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                           local_150);
              }
            }
          }
          *ppvVar10 = (void *)0x0;
          ppvVar10[2] = (void *)0x0;
          *(undefined4 *)(ppvVar10 + 3) = 0;
          *(undefined4 *)(ppvVar10 + 5) = 0;
          *(undefined4 *)((long)ppvVar10 + 0x2c) = 0;
          *(undefined4 *)(ppvVar10 + 6) = 0;
          *(undefined4 *)((long)ppvVar10 + 0x34) = 0;
          *(undefined4 *)(ppvVar10 + 7) = 0;
          ppvVar10[8] = (void *)0x0;
          ppvVar10[1] = (void *)0x0;
        }
        if (local_104 == 1) {
          if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
             (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1)) &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            lVar1 = *(long *)(*in_RDI + -0x18);
            plVar7 = (long *)((long)in_RDI + lVar1 + 0x168);
            plVar9 = in_RDI + 5;
            if (plVar9 != plVar7) {
              if (*(long *)((long)in_RDI + lVar1 + 0x170) != 0) {
                piVar2 = *(int **)((long)in_RDI + lVar1 + 0x170);
                LOCK();
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
              if (in_RDI[6] != 0) {
                piVar2 = (int *)in_RDI[6];
                LOCK();
                iVar11 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (iVar11 == 1) {
                  if (in_RDI[9] == 0) {
                    if ((void *)*plVar9 != (void *)0x0) {
                      free((void *)*plVar9);
                    }
                  }
                  else {
                    (**(code **)(*(long *)in_RDI[9] + 0x18))((long *)in_RDI[9],*plVar9);
                  }
                }
              }
              *plVar9 = 0;
              in_RDI[7] = 0;
              *(undefined4 *)(in_RDI + 8) = 0;
              *(undefined4 *)(in_RDI + 10) = 0;
              *(undefined4 *)((long)in_RDI + 0x54) = 0;
              *(undefined4 *)(in_RDI + 0xb) = 0;
              *(undefined4 *)((long)in_RDI + 0x5c) = 0;
              *(undefined4 *)(in_RDI + 0xc) = 0;
              in_RDI[0xd] = 0;
              in_RDI[6] = 0;
              *plVar9 = *plVar7;
              in_RDI[6] = *(long *)((long)in_RDI + lVar1 + 0x170);
              in_RDI[7] = *(long *)((long)in_RDI + lVar1 + 0x178);
              *(undefined4 *)(in_RDI + 8) = *(undefined4 *)((long)in_RDI + lVar1 + 0x180);
              in_RDI[9] = *(long *)((long)in_RDI + lVar1 + 0x188);
              *(undefined4 *)(in_RDI + 10) = *(undefined4 *)((long)in_RDI + lVar1 + 400);
              *(undefined4 *)((long)in_RDI + 0x54) = *(undefined4 *)((long)in_RDI + lVar1 + 0x194);
              *(undefined4 *)(in_RDI + 0xb) = *(undefined4 *)((long)in_RDI + lVar1 + 0x198);
              *(undefined4 *)((long)in_RDI + 0x5c) = *(undefined4 *)((long)in_RDI + lVar1 + 0x19c);
              *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0);
              in_RDI[0xd] = *(long *)((long)in_RDI + lVar1 + 0x1a8);
            }
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3)) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1 &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            lVar1 = *(long *)(*in_RDI + -0x18);
            plVar7 = (long *)((long)in_RDI + lVar1 + 0x168);
            plVar9 = in_RDI + 5;
            if (plVar9 != plVar7) {
              if (*(long *)((long)in_RDI + lVar1 + 0x170) != 0) {
                piVar2 = *(int **)((long)in_RDI + lVar1 + 0x170);
                LOCK();
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
              if (in_RDI[6] != 0) {
                piVar2 = (int *)in_RDI[6];
                LOCK();
                iVar11 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (iVar11 == 1) {
                  if (in_RDI[9] == 0) {
                    if ((void *)*plVar9 != (void *)0x0) {
                      free((void *)*plVar9);
                    }
                  }
                  else {
                    (**(code **)(*(long *)in_RDI[9] + 0x18))((long *)in_RDI[9],*plVar9);
                  }
                }
              }
              *plVar9 = 0;
              in_RDI[7] = 0;
              *(undefined4 *)(in_RDI + 8) = 0;
              *(undefined4 *)(in_RDI + 10) = 0;
              *(undefined4 *)((long)in_RDI + 0x54) = 0;
              *(undefined4 *)(in_RDI + 0xb) = 0;
              *(undefined4 *)((long)in_RDI + 0x5c) = 0;
              *(undefined4 *)(in_RDI + 0xc) = 0;
              in_RDI[0xd] = 0;
              in_RDI[6] = 0;
              *plVar9 = *plVar7;
              in_RDI[6] = *(long *)((long)in_RDI + lVar1 + 0x170);
              in_RDI[7] = *(long *)((long)in_RDI + lVar1 + 0x178);
              *(undefined4 *)(in_RDI + 8) = *(undefined4 *)((long)in_RDI + lVar1 + 0x180);
              in_RDI[9] = *(long *)((long)in_RDI + lVar1 + 0x188);
              *(undefined4 *)(in_RDI + 10) = *(undefined4 *)((long)in_RDI + lVar1 + 400);
              *(undefined4 *)((long)in_RDI + 0x54) = *(undefined4 *)((long)in_RDI + lVar1 + 0x194);
              *(undefined4 *)(in_RDI + 0xb) = *(undefined4 *)((long)in_RDI + lVar1 + 0x198);
              *(undefined4 *)((long)in_RDI + 0x5c) = *(undefined4 *)((long)in_RDI + lVar1 + 0x19c);
              *(undefined4 *)(in_RDI + 0xc) = *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0);
              in_RDI[0xd] = *(long *)((long)in_RDI + lVar1 + 0x1a8);
            }
          }
          else {
            create_group_ops(in_stack_000006a8,in_stack_000006a0);
          }
        }
        if (((ulong)in_RSI->data & 1) != 0) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          puVar8 = (undefined8 *)((long)in_RDI + lVar1 + 0x168);
          if (*(long *)((long)in_RDI + lVar1 + 0x170) != 0) {
            piVar2 = *(int **)((long)in_RDI + lVar1 + 0x170);
            LOCK();
            iVar11 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (iVar11 == 1) {
              if (*(long *)((long)in_RDI + lVar1 + 0x188) == 0) {
                if ((void *)*puVar8 != (void *)0x0) {
                  free((void *)*puVar8);
                }
              }
              else {
                plVar7 = *(long **)((long)in_RDI + lVar1 + 0x188);
                (**(code **)(*plVar7 + 0x18))(plVar7,*puVar8);
              }
            }
          }
          *puVar8 = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x178) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x180) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 400) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x194) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x198) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x19c) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x1a8) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x170) = 0;
        }
        local_e4 = 0;
      }
      else {
        create_group_ops(in_stack_000006a8,in_stack_000006a0);
        if (((ulong)in_RSI->data & 1) != 0) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          puVar8 = (undefined8 *)((long)in_RDI + lVar1 + 0x168);
          if (*(long *)((long)in_RDI + lVar1 + 0x170) != 0) {
            piVar2 = *(int **)((long)in_RDI + lVar1 + 0x170);
            LOCK();
            iVar11 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (iVar11 == 1) {
              if (*(long *)((long)in_RDI + lVar1 + 0x188) == 0) {
                if ((void *)*puVar8 != (void *)0x0) {
                  free((void *)*puVar8);
                }
              }
              else {
                plVar7 = *(long **)((long)in_RDI + lVar1 + 0x188);
                (**(code **)(*plVar7 + 0x18))(plVar7,*puVar8);
              }
            }
          }
          *puVar8 = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x178) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x180) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 400) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x194) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x198) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x19c) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x1a0) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x1a8) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x170) = 0;
        }
        local_e4 = 0;
      }
    }
    else {
      local_e4 = create_pipeline_int8_x86(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    }
  }
  else {
    local_e4 = 0;
  }
  return local_e4;
}

Assistant:

int ConvolutionDepthWise_x86::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}